

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O3

void __thiscall sf::Text::Text(Text *this)

{
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Drawable_001e5cf8;
  Transformable::Transformable(&this->super_Transformable);
  (this->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__Text_001e7638;
  (this->super_Transformable)._vptr_Transformable = (_func_int **)&PTR__Text_001e7660;
  String::String(&this->m_string);
  this->m_font = (Font *)0x0;
  this->m_characterSize = 0x1e;
  this->m_letterSpacingFactor = 1.0;
  this->m_lineSpacingFactor = 1.0;
  this->m_style = 0;
  Color::Color(&this->m_fillColor,0xff,0xff,0xff,0xff);
  Color::Color(&this->m_outlineColor,'\0','\0','\0',0xff);
  this->m_outlineThickness = 0.0;
  VertexArray::VertexArray(&this->m_vertices,Triangles,0);
  VertexArray::VertexArray(&this->m_outlineVertices,Triangles,0);
  this->m_fontTextureId = 0;
  (this->m_bounds).left = 0.0;
  (this->m_bounds).top = 0.0;
  (this->m_bounds).width = 0.0;
  (this->m_bounds).height = 0.0;
  this->m_geometryNeedUpdate = false;
  return;
}

Assistant:

Text::Text() :
m_string             (),
m_font               (NULL),
m_characterSize      (30),
m_letterSpacingFactor(1.f),
m_lineSpacingFactor  (1.f),
m_style              (Regular),
m_fillColor          (255, 255, 255),
m_outlineColor       (0, 0, 0),
m_outlineThickness   (0),
m_vertices           (Triangles),
m_outlineVertices    (Triangles),
m_bounds             (),
m_geometryNeedUpdate (false),
m_fontTextureId      (0)
{

}